

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_accessors_kernels.h
# Opt level: O0

P * ref_volocal(P *v,Dimensions dims,int nu,int immax,int im,int iu)

{
  int iu_local;
  int im_local;
  int immax_local;
  int nu_local;
  P *v_local;
  
  if (v == (P *)0x0) {
    __assert_fail("v",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                  ,0x141,
                  "P *ref_volocal(P *const restrict, const Dimensions, const int, const int, const int, const int)"
                 );
  }
  if (nu < 1) {
    __assert_fail("nu > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                  ,0x142,
                  "P *ref_volocal(P *const restrict, const Dimensions, const int, const int, const int, const int)"
                 );
  }
  if ((im < 0) || (immax <= im)) {
    __assert_fail("im >= 0 && im < immax",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                  ,0x143,
                  "P *ref_volocal(P *const restrict, const Dimensions, const int, const int, const int, const int)"
                 );
  }
  if ((-1 < iu) && (iu < nu)) {
    return v + (im + immax * iu);
  }
  __assert_fail("iu >= 0 && iu < nu",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                ,0x144,
                "P *ref_volocal(P *const restrict, const Dimensions, const int, const int, const int, const int)"
               );
}

Assistant:

TARGET_HD static inline P* ref_volocal(
    P* const __restrict__  v,
    const Dimensions       dims,
    const int              nu,
    const int              immax,
    const int              im,
    const int              iu )
{
  Assert( v );
  Assert( nu > 0 );
  Assert( im >= 0 && im < immax );
  Assert( iu >= 0 && iu < nu );

  return & v[ im + immax * (
              iu + nu    * (
              0 )) ];
}